

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddReportBlock
          (RTCPCompoundPacketBuilder *this,uint32_t ssrc,uint8_t fractionlost,int32_t packetslost,
          uint32_t exthighestseq,uint32_t jitter,uint32_t lsr,uint32_t dlsr)

{
  size_t sVar1;
  size_t sVar2;
  uint32_t uVar3;
  size_t sVar4;
  RTPMemoryManager *mgr;
  Buffer local_70;
  uint32_t local_5c;
  uint32_t *puStack_58;
  uint32_t packlost2;
  uint32_t *packlost;
  RTCPReceiverReport *rr;
  uint8_t *buf;
  size_t reportsizewithextrablock;
  size_t totalothersize;
  uint32_t local_28;
  uint32_t jitter_local;
  uint32_t exthighestseq_local;
  int32_t packetslost_local;
  uint8_t fractionlost_local;
  RTCPCompoundPacketBuilder *pRStack_18;
  uint32_t ssrc_local;
  RTCPCompoundPacketBuilder *this_local;
  
  if ((this->arebuilding & 1U) == 0) {
    this_local._4_4_ = -0x2a;
  }
  else if ((this->report).headerlength == 0) {
    this_local._4_4_ = -0x2c;
  }
  else {
    sVar1 = this->byesize;
    sVar2 = this->appsize;
    totalothersize._4_4_ = jitter;
    local_28 = exthighestseq;
    jitter_local = packetslost;
    exthighestseq_local._3_1_ = fractionlost;
    packetslost_local = ssrc;
    pRStack_18 = this;
    sVar4 = SDES::NeededBytes(&this->sdes);
    reportsizewithextrablock = sVar1 + sVar2 + sVar4;
    buf = (uint8_t *)Report::NeededBytesWithExtraReportBlock(&this->report);
    if ((uint8_t *)this->maximumpacketsize < buf + reportsizewithextrablock) {
      this_local._4_4_ = -0x2b;
    }
    else {
      mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      packlost = (uint32_t *)operator_new__(0x18,mgr,0x12);
      if ((RTCPReceiverReport *)packlost == (RTCPReceiverReport *)0x0) {
        this_local._4_4_ = -1;
      }
      else {
        puStack_58 = &jitter_local;
        local_5c = jitter_local;
        rr = (RTCPReceiverReport *)packlost;
        uVar3 = htonl(packetslost_local);
        *packlost = uVar3;
        *(uint8_t *)(packlost + 1) = exthighestseq_local._3_1_;
        *(char *)((long)packlost + 7) = (char)local_5c;
        *(char *)((long)packlost + 6) = (char)(local_5c >> 8);
        *(char *)((long)packlost + 5) = (char)(local_5c >> 0x10);
        uVar3 = htonl(local_28);
        packlost[2] = uVar3;
        uVar3 = htonl(totalothersize._4_4_);
        packlost[3] = uVar3;
        uVar3 = htonl(lsr);
        packlost[4] = uVar3;
        uVar3 = htonl(dlsr);
        packlost[5] = uVar3;
        Buffer::Buffer(&local_70,(uint8_t *)rr,0x18);
        std::__cxx11::
        list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
        ::push_back(&(this->report).reportblocks,&local_70);
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTCPCompoundPacketBuilder::AddReportBlock(uint32_t ssrc,uint8_t fractionlost,int32_t packetslost,uint32_t exthighestseq,
	                                      uint32_t jitter,uint32_t lsr,uint32_t dlsr)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;
	if (report.headerlength == 0)
		return ERR_RTP_RTCPCOMPPACKBUILDER_REPORTNOTSTARTED;

#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalothersize = byesize+appsize+sdes.NeededBytes();
#else
	size_t totalothersize = byesize+appsize+unknownsize+sdes.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	size_t reportsizewithextrablock = report.NeededBytesWithExtraReportBlock();
	
	if ((totalothersize+reportsizewithextrablock) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	uint8_t *buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPRECEIVERREPORT) uint8_t[sizeof(RTCPReceiverReport)];
	if (buf == 0)
		return ERR_RTP_OUTOFMEM;
	
	RTCPReceiverReport *rr = (RTCPReceiverReport *)buf;
	uint32_t *packlost = (uint32_t *)&packetslost;
	uint32_t packlost2 = (*packlost);
		
	rr->ssrc = htonl(ssrc);
	rr->fractionlost = fractionlost;
	rr->packetslost[2] = (uint8_t)(packlost2&0xFF);
	rr->packetslost[1] = (uint8_t)((packlost2>>8)&0xFF);
	rr->packetslost[0] = (uint8_t)((packlost2>>16)&0xFF);
	rr->exthighseqnr = htonl(exthighestseq);
	rr->jitter = htonl(jitter);
	rr->lsr = htonl(lsr);
	rr->dlsr = htonl(dlsr);

	report.reportblocks.push_back(Buffer(buf,sizeof(RTCPReceiverReport)));
	return 0;
}